

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O2

Oop __thiscall Lodtalk::Class::getBinding(Class *this,VMContext *context)

{
  Oop OVar1;
  
  OVar1 = VMContext::getGlobalFromSymbol(context,(Oop)(this->name).field_0);
  if (OVar1.field_0 != (anon_union_8_4_0eb573b0_for_Oop_0)&NilObject) {
    return (Oop)OVar1.field_0;
  }
  OVar1.field_0 =
       (anon_union_8_4_0eb573b0_for_Oop_0)Association::make(context,(Oop)&NilObject,(Oop)this);
  return (Oop)OVar1.field_0;
}

Assistant:

Oop Class::getBinding(VMContext *context)
{
	// Find myself in the global dictionary
	auto result = context->getGlobalFromSymbol(name);
	if(!isNil(result))
		return result;

	// TODO: Find an existing
	return Oop::fromPointer(Association::make(context, nilOop(), selfOop()));
}